

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

void __thiscall ADPlanner::PrintSearchState(ADPlanner *this,ADState *searchstateinfo,FILE *fOut)

{
  undefined8 in_RSI;
  long *in_RDI;
  CKey key;
  CKey aCStack_28 [2];
  
  (**(code **)(*in_RDI + 0x1b0))(aCStack_28,in_RDI,in_RSI);
  CKey::~CKey(aCStack_28);
  return;
}

Assistant:

void ADPlanner::PrintSearchState(ADState* searchstateinfo, FILE* fOut)
{
    CKey key = ComputeKey(searchstateinfo);
#if DEBUG
    SBPL_FPRINTF(fOut, "g=%d v=%d h = %d heapindex=%d inconslist=%d key=[%d %d] iterc=%d callnuma=%d expands=%d (current callnum=%d iter=%d)",
        searchstateinfo->g, searchstateinfo->v, searchstateinfo->h, searchstateinfo->heapindex, (searchstateinfo->listelem[AD_INCONS_LIST_ID] != NULL),
        (int)key[0], (int)key[1], searchstateinfo->iterationclosed, searchstateinfo->callnumberaccessed, searchstateinfo->numofexpands,
        this->pSearchStateSpace_->callnumber, this->pSearchStateSpace_->searchiteration);
#else
    SBPL_FPRINTF(fOut, "g=%d v=%d h = %d heapindex=%d inconslist=%d key=[%d %d] iterc=%d callnuma=%d "
                 "(current callnum=%d iter=%d)",
                 searchstateinfo->g, searchstateinfo->v, searchstateinfo->h, searchstateinfo->heapindex,
                 (searchstateinfo->listelem[AD_INCONS_LIST_ID] != NULL), (int)key[0], (int)key[1],
                 searchstateinfo->iterationclosed, searchstateinfo->callnumberaccessed,
                 this->pSearchStateSpace_->callnumber, this->pSearchStateSpace_->searchiteration);
#endif
}